

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool prvTidyParseConfigValue(TidyDocImpl *doc,TidyOptionId optId,ctmbstr optval)

{
  bool bVar1;
  uint uVar2;
  Bool BVar3;
  StreamIn *in;
  TidyOptionImpl *pTVar4;
  TidyBuffer inbuf;
  TidyBuffer TStack_48;
  
  if (optId < N_TIDY_OPTIONS) {
    pTVar4 = option_defs + optId;
    bVar1 = optval != (ctmbstr)0x0 && option_defs[optId].parser != (ParseProperty *)0x0;
  }
  else {
    pTVar4 = (TidyOptionImpl *)0x0;
    bVar1 = false;
  }
  if (bVar1) {
    tidyBufInitWithAllocator(&TStack_48,doc->allocator);
    uVar2 = prvTidytmbstrlen(optval);
    tidyBufAttach(&TStack_48,(byte *)optval,uVar2 + 1);
    in = prvTidyBufferInput(doc,&TStack_48,0);
    (doc->config).cfgIn = in;
    if (in == (StreamIn *)0x0) {
      uVar2 = 0xffffffff;
    }
    else {
      uVar2 = prvTidyReadChar(in);
    }
    (doc->config).c = uVar2;
    BVar3 = (*pTVar4->parser)(doc,pTVar4);
    prvTidyfreeStreamIn((doc->config).cfgIn);
    (doc->config).cfgIn = (StreamIn *)0x0;
    tidyBufDetach(&TStack_48);
  }
  else {
    BVar3 = no;
    if (pTVar4 == (TidyOptionImpl *)0x0) {
      prvTidytmbsnprintf((tmbstr)&TStack_48,0xb,"%u");
      prvTidyReportUnknownOption(doc,(ctmbstr)&TStack_48);
    }
    else {
      prvTidyReportBadArgument(doc,pTVar4->name);
    }
  }
  return BVar3;
}

Assistant:

Bool TY_(ParseConfigValue)( TidyDocImpl* doc, TidyOptionId optId, ctmbstr optval )
{
    const TidyOptionImpl* option = NULL;
    /* #472: fail status if there is a NULL parser. @ralfjunker */
    Bool status = ( optId < N_TIDY_OPTIONS
                   && (option = option_defs + optId)->parser
                   && optval != NULL );

    if ( !status )
        if ( option )
            TY_(ReportBadArgument)(doc, option->name);
        else
        {
            /* If optId < N_TIDY_OPTIONS then option remains unassigned,
               and we have to fall back to an ugly error message. */
            enum { sizeBuf = 11 }; /* uint_max is 10 characters */
            char buffer[sizeBuf];
            TY_(tmbsnprintf(buffer, sizeBuf, "%u", optId));
            TY_(ReportUnknownOption(doc, buffer));
        }
    else
    {
        TidyBuffer inbuf;            /* Set up input source */
        tidyBufInitWithAllocator( &inbuf, doc->allocator );
        tidyBufAttach( &inbuf, (byte*)optval, TY_(tmbstrlen)(optval)+1 );
        if (optId == TidyOutFile)
            doc->config.cfgIn = TY_(BufferInput)( doc, &inbuf, RAW );
        else
            doc->config.cfgIn = TY_(BufferInput)( doc, &inbuf, RAW ); /* Issue #468 - Was ASCII! */
        doc->config.c = GetC( &doc->config );

        status = option->parser( doc, option );

        TY_(freeStreamIn)(doc->config.cfgIn);  /* Release input source */
        doc->config.cfgIn  = NULL;
        tidyBufDetach( &inbuf );
    }
    return status;
}